

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteCord
          (CopyingOutputStreamAdaptor *this,Cord *cord)

{
  size_t sVar1;
  int iVar2;
  reference rVar3;
  ChunkIterator __begin2;
  ChunkIterator local_b0;
  
  absl::lts_20240722::Cord::ChunkIterator::ChunkIterator(&local_b0,cord);
  while (sVar1 = local_b0.bytes_remaining_, local_b0.bytes_remaining_ != 0) {
    rVar3 = absl::lts_20240722::Cord::ChunkIterator::operator*(&local_b0);
    iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[5])
                      (this,rVar3._M_str,(ulong)(uint)rVar3._M_len);
    if ((char)iVar2 == '\0') break;
    absl::lts_20240722::Cord::ChunkIterator::operator++(&local_b0);
  }
  return sVar1 == 0;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteCord(const absl::Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    if (!WriteAliasedRaw(chunk.data(), chunk.size())) {
      return false;
    }
  }
  return true;
}